

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::RadixPartitionedHashTable::Finalize
          (RadixPartitionedHashTable *this,ClientContext *context,GlobalSinkState *gstate_p)

{
  vector<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>,std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>>>
  *this_00;
  ulong uVar1;
  type this_01;
  idx_t iVar2;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar3;
  pointer pTVar4;
  idx_t *piVar5;
  idx_t iVar6;
  ulong uVar7;
  reference pvVar8;
  pointer pAVar9;
  pointer pTVar10;
  unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
  *this_02;
  long lVar11;
  size_type __n;
  bool bVar12;
  bool bVar13;
  duckdb local_38 [8];
  
  if (*(long *)((long)&gstate_p[2].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex +
               8) == 0) {
    gstate_p[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align = 0;
  }
  else {
    this_01 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
              ::operator*((unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                           *)((long)&gstate_p[2].super_StateWithBlockableTasks.lock.
                                     super___mutex_base._M_mutex + 8));
    iVar2 = PartitionedTupleData::Count(this_01);
    gstate_p[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align = iVar2;
    if (((gstate_p[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[9] & 1U)
         == 0) &&
       (*(long *)((long)&gstate_p[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex
                 + 0x10) == 1)) {
      bVar13 = gstate_p[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
               __list.__prev == (__pthread_internal_list *)0x1;
    }
    else {
      bVar13 = false;
    }
    puVar3 = PartitionedTupleData::GetPartitions(this_01);
    __n = (long)(puVar3->
                super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(puVar3->
                super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
    this_00 = (vector<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>,std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>>>
               *)&gstate_p[2].super_StateWithBlockableTasks.blocked_tasks.
                  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
                  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    ::std::
    vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
    ::reserve((vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>_>_>
               *)this_00,__n);
    lVar11 = 0;
    while (bVar12 = __n != 0, __n = __n - 1, bVar12) {
      this_02 = (unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                 *)((long)&(((puVar3->
                             super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                           )._M_t + lVar11);
      pTVar4 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
               ::operator->(this_02);
      iVar2 = TupleDataCollection::SizeInBytes(pTVar4);
      pTVar4 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
               ::operator->(this_02);
      piVar5 = TupleDataCollection::Count(pTVar4);
      iVar6 = GroupedAggregateHashTable::GetCapacityForCount(*piVar5);
      uVar7 = iVar2 + iVar6 * 8;
      uVar1 = *(ulong *)((long)&gstate_p[3].super_StateWithBlockableTasks.lock.super___mutex_base.
                                _M_mutex + 8);
      if (uVar7 < uVar1) {
        uVar7 = uVar1;
      }
      *(ulong *)((long)&gstate_p[3].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex +
                8) = uVar7;
      make_uniq<duckdb::AggregatePartition,duckdb::unique_ptr<duckdb::TupleDataCollection,std::default_delete<duckdb::TupleDataCollection>,true>>
                (local_38,this_02);
      ::std::
      vector<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>,std::allocator<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::AggregatePartition,std::default_delete<duckdb::AggregatePartition>,true>>
                (this_00,(unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
                          *)local_38);
      ::std::
      unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>_>::
      ~unique_ptr((unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>_>
                   *)local_38);
      if (bVar13) {
        LOCK();
        gstate_p[3]._vptr_GlobalSinkState =
             (_func_int **)((long)gstate_p[3]._vptr_GlobalSinkState + 1);
        UNLOCK();
        pvVar8 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
                 ::back((vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
                         *)this_00);
        pAVar9 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
                 ::operator->(pvVar8);
        LOCK();
        (pAVar9->progress)._M_i = 1.0;
        UNLOCK();
        pvVar8 = vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
                 ::back((vector<duckdb::unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>,_true>
                         *)this_00);
        pAVar9 = unique_ptr<duckdb::AggregatePartition,_std::default_delete<duckdb::AggregatePartition>,_true>
                 ::operator->(pvVar8);
        pAVar9->state = READY_TO_SCAN;
      }
      lVar11 = lVar11 + 8;
    }
  }
  pTVar10 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
            ::operator->((unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                          *)&gstate_p[1].super_StateWithBlockableTasks);
  TemporaryMemoryState::SetMinimumReservation
            (pTVar10,(idx_t)(&(gstate_p[2].super_StateWithBlockableTasks.blocked_tasks.
                               super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                               .
                               super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                               ._M_impl.super__Vector_impl_data._M_start)->mode +
                            *(long *)((long)&gstate_p[3].super_StateWithBlockableTasks.lock.
                                             super___mutex_base._M_mutex + 8)));
  pTVar10 = unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
            ::operator->((unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>,_true>
                          *)&gstate_p[1].super_StateWithBlockableTasks);
  TemporaryMemoryState::SetZero(pTVar10);
  gstate_p[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__size[8] = '\x01';
  return;
}

Assistant:

void RadixPartitionedHashTable::Finalize(ClientContext &context, GlobalSinkState &gstate_p) const {
	auto &gstate = gstate_p.Cast<RadixHTGlobalSinkState>();

	if (gstate.uncombined_data) {
		auto &uncombined_data = *gstate.uncombined_data;
		gstate.count_before_combining = uncombined_data.Count();

		// If true there is no need to combine, it was all done by a single thread in a single HT
		const auto single_ht = !gstate.external && gstate.active_threads == 1 && gstate.number_of_threads == 1;

		auto &uncombined_partition_data = uncombined_data.GetPartitions();
		const auto n_partitions = uncombined_partition_data.size();
		gstate.partitions.reserve(n_partitions);
		for (idx_t i = 0; i < n_partitions; i++) {
			auto &partition = uncombined_partition_data[i];
			auto partition_size =
			    partition->SizeInBytes() +
			    GroupedAggregateHashTable::GetCapacityForCount(partition->Count()) * sizeof(ht_entry_t);
			gstate.max_partition_size = MaxValue(gstate.max_partition_size, partition_size);

			gstate.partitions.emplace_back(make_uniq<AggregatePartition>(std::move(partition)));
			if (single_ht) {
				gstate.finalize_done++;
				gstate.partitions.back()->progress = 1;
				gstate.partitions.back()->state = AggregatePartitionState::READY_TO_SCAN;
			}
		}
	} else {
		gstate.count_before_combining = 0;
	}

	// Minimum of combining one partition at a time
	gstate.temporary_memory_state->SetMinimumReservation(gstate.stored_allocators_size + gstate.max_partition_size);
	// Set size to 0 until the scan actually starts
	gstate.temporary_memory_state->SetZero();
	gstate.finalized = true;
}